

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryInputGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
vkt::geometry::anon_unknown_2::GeometryInputTestInstance::genVertexAttribData
          (GeometryInputTestInstance *this)

{
  pointer pVVar1;
  ulong uVar2;
  long lVar3;
  undefined4 uVar4;
  
  (this->super_GeometryExpanderRenderTestInstance).m_numDrawVertices = 0xc;
  lVar3 = 0xc;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryExpanderRenderTestInstance).m_vertexPosData,0xc);
  pVVar1 = (this->super_GeometryExpanderRenderTestInstance).m_vertexPosData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1->m_data[0] = -0.5;
  pVVar1->m_data[1] = -0.2;
  pVVar1->m_data[2] = 0.0;
  pVVar1->m_data[3] = 1.0;
  pVVar1 = (this->super_GeometryExpanderRenderTestInstance).m_vertexPosData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[1].m_data[0] = -0.8;
  pVVar1[1].m_data[1] = -0.5;
  pVVar1[1].m_data[2] = 0.0;
  pVVar1[1].m_data[3] = 1.0;
  pVVar1 = (this->super_GeometryExpanderRenderTestInstance).m_vertexPosData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[2].m_data[0] = -0.5;
  pVVar1[2].m_data[1] = -0.5;
  pVVar1[2].m_data[2] = 0.0;
  pVVar1[2].m_data[3] = 1.0;
  pVVar1 = (this->super_GeometryExpanderRenderTestInstance).m_vertexPosData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[3].m_data[0] = -0.19999999;
  pVVar1[3].m_data[1] = 0.10000001;
  pVVar1[3].m_data[2] = 0.0;
  pVVar1[3].m_data[3] = 1.0;
  pVVar1 = (this->super_GeometryExpanderRenderTestInstance).m_vertexPosData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[4].m_data[0] = -0.19999999;
  pVVar1[4].m_data[1] = -0.2;
  pVVar1[4].m_data[2] = 0.0;
  pVVar1[4].m_data[3] = 1.0;
  pVVar1 = (this->super_GeometryExpanderRenderTestInstance).m_vertexPosData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[5].m_data[0] = -0.5;
  pVVar1[5].m_data[1] = -0.8;
  pVVar1[5].m_data[2] = 0.0;
  pVVar1[5].m_data[3] = 1.0;
  pVVar1 = (this->super_GeometryExpanderRenderTestInstance).m_vertexPosData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[6].m_data[0] = -0.19999999;
  pVVar1[6].m_data[1] = -0.5;
  pVVar1[6].m_data[2] = 0.0;
  pVVar1[6].m_data[3] = 1.0;
  pVVar1 = (this->super_GeometryExpanderRenderTestInstance).m_vertexPosData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[7].m_data[0] = 0.100000024;
  pVVar1[7].m_data[1] = 0.10000001;
  pVVar1[7].m_data[2] = 0.0;
  pVVar1[7].m_data[3] = 1.0;
  pVVar1 = (this->super_GeometryExpanderRenderTestInstance).m_vertexPosData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[8].m_data[0] = 0.100000024;
  pVVar1[8].m_data[1] = -0.2;
  pVVar1[8].m_data[2] = 0.0;
  pVVar1[8].m_data[3] = 1.0;
  pVVar1 = (this->super_GeometryExpanderRenderTestInstance).m_vertexPosData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[9].m_data[0] = -0.19999999;
  pVVar1[9].m_data[1] = -0.8;
  pVVar1[9].m_data[2] = 0.0;
  pVVar1[9].m_data[3] = 1.0;
  pVVar1 = (this->super_GeometryExpanderRenderTestInstance).m_vertexPosData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[10].m_data[0] = 0.100000024;
  pVVar1[10].m_data[1] = -0.5;
  pVVar1[10].m_data[2] = 0.0;
  pVVar1[10].m_data[3] = 1.0;
  pVVar1 = (this->super_GeometryExpanderRenderTestInstance).m_vertexPosData.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[0xb].m_data[0] = 0.40000004;
  pVVar1[0xb].m_data[1] = -0.2;
  pVVar1[0xb].m_data[2] = 0.0;
  pVVar1[0xb].m_data[3] = 1.0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryExpanderRenderTestInstance).m_vertexAttrData,
             (long)(this->super_GeometryExpanderRenderTestInstance).m_numDrawVertices);
  if (0 < (this->super_GeometryExpanderRenderTestInstance).m_numDrawVertices) {
    uVar2 = 0;
    do {
      uVar4 = 0x3f800000;
      if ((uVar2 & 1) != 0) {
        uVar4 = 0;
      }
      pVVar1 = (this->super_GeometryExpanderRenderTestInstance).m_vertexAttrData.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)((long)pVVar1->m_data + lVar3 + -0xc) = 0x3f800000;
      *(undefined4 *)((long)pVVar1->m_data + lVar3 + -8) = uVar4;
      *(undefined4 *)((long)pVVar1->m_data + lVar3 + -4) = uVar4;
      *(undefined4 *)((long)pVVar1->m_data + lVar3) = 0x3f800000;
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while ((long)uVar2 < (long)(this->super_GeometryExpanderRenderTestInstance).m_numDrawVertices)
    ;
  }
  return;
}

Assistant:

void GeometryInputTestInstance::genVertexAttribData (void)
{
	// Create 1 X 2 grid in triangle strip adjacent - order
	const float	scale	= 0.3f;
	const Vec4	offset	(-0.5f, -0.2f, 0.0f, 1.0f);
	m_numDrawVertices	= 12;

	m_vertexPosData.resize(m_numDrawVertices);
	m_vertexPosData[ 0] = Vec4( 0,  0, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 1] = Vec4(-1, -1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 2] = Vec4( 0, -1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 3] = Vec4( 1,  1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 4] = Vec4( 1,  0, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 5] = Vec4( 0, -2, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 6] = Vec4( 1, -1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 7] = Vec4( 2,  1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 8] = Vec4( 2,  0, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 9] = Vec4( 1, -2, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[10] = Vec4( 2, -1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[11] = Vec4( 3,  0, 0.0f, 0.0f) * scale + offset;

	// Red and white
	m_vertexAttrData.resize(m_numDrawVertices);
	for (int i = 0; i < m_numDrawVertices; ++i)
		m_vertexAttrData[i] = (i % 2 == 0) ? Vec4(1, 1, 1, 1) : Vec4(1, 0, 0, 1);
}